

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorBits.c
# Opt level: O0

void InsertVars(Cube *pC,int *pVars,int nVarsIn,int *pVarValues)

{
  int iVar1;
  byte bVar2;
  int local_38;
  int i;
  int LocalBit;
  int LocalWord;
  int GlobalBit;
  int *pVarValues_local;
  int nVarsIn_local;
  int *pVars_local;
  Cube *pC_local;
  
  if ((nVarsIn < 1) || (g_CoverInfo.nVarsIn < nVarsIn)) {
    __assert_fail("nVarsIn > 0 && nVarsIn <= g_CoverInfo.nVarsIn",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                  ,0x17d,"void InsertVars(Cube *, int *, int, int *)");
  }
  local_38 = 0;
  while( true ) {
    if (nVarsIn <= local_38) {
      return;
    }
    if ((pVars[local_38] < 0) || (g_CoverInfo.nVarsIn <= pVars[local_38])) break;
    if (((pVarValues[local_38] != 1) && (pVarValues[local_38] != 2)) && (pVarValues[local_38] != 3))
    {
      __assert_fail("pVarValues[i] == VAR_NEG || pVarValues[i] == VAR_POS || pVarValues[i] == VAR_ABS"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                    ,0x181,"void InsertVars(Cube *, int *, int, int *)");
    }
    iVar1 = (pVars[local_38] << 1) >> 5;
    bVar2 = (byte)(pVars[local_38] << 1) & 0x1f;
    pC->pCubeDataIn[iVar1] =
         pC->pCubeDataIn[iVar1] & (3 << bVar2 ^ 0xffffffffU) | pVarValues[local_38] << bVar2;
    local_38 = local_38 + 1;
  }
  __assert_fail("pVars[i] >= 0 && pVars[i] < g_CoverInfo.nVarsIn",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                ,0x180,"void InsertVars(Cube *, int *, int, int *)");
}

Assistant:

void InsertVars( Cube * pC, int * pVars, int nVarsIn, int * pVarValues )
// corrects the given number of variables (nVarsIn) in pC->pCubeDataIn[]
// variable numbers are given in pVarNumbers[], their values are in pVarValues[]
// arrays pVarNumbers[] and pVarValues[] are provided by the user
{
    int GlobalBit;
    int LocalWord;
    int LocalBit;
    int i;
    assert( nVarsIn > 0 && nVarsIn <= g_CoverInfo.nVarsIn );
    for ( i = 0; i < nVarsIn; i++ )
    {
        assert( pVars[i] >= 0 && pVars[i] < g_CoverInfo.nVarsIn );
        assert( pVarValues[i] == VAR_NEG || pVarValues[i] == VAR_POS || pVarValues[i] == VAR_ABS );
        GlobalBit = (pVars[i]<<1);
        LocalWord = VarWord(GlobalBit);
        LocalBit  = VarBit(GlobalBit);

        // correct this variables
        pC->pCubeDataIn[LocalWord] = ((pC->pCubeDataIn[LocalWord]&(~(3<<LocalBit)))|(pVarValues[i]<<LocalBit));
    }
}